

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O0

void re_insert(EditLine *el,wchar_t *d,wchar_t dat,wchar_t dlen,wchar_t *s,wchar_t num)

{
  wchar_t *local_40;
  wchar_t *b;
  wchar_t *a;
  wchar_t *pwStack_28;
  wchar_t num_local;
  wchar_t *s_local;
  wchar_t dlen_local;
  wchar_t dat_local;
  wchar_t *d_local;
  EditLine *el_local;
  
  if (L'\0' < num) {
    a._4_4_ = num;
    if (dlen - dat < num) {
      a._4_4_ = dlen - dat;
    }
    if (L'\0' < a._4_4_) {
      local_40 = d + (long)dlen + -1;
      b = d + (long)dlen + -1 + -(long)a._4_4_;
      while (d + dat <= b) {
        *local_40 = *b;
        local_40 = local_40 + -1;
        b = b + -1;
      }
      d[dlen] = L'\0';
    }
    b = d + dat;
    pwStack_28 = s;
    for (; b < d + dlen && L'\0' < a._4_4_; a._4_4_ = a._4_4_ + L'\xffffffff') {
      *b = *pwStack_28;
      b = b + 1;
      pwStack_28 = pwStack_28 + 1;
    }
  }
  return;
}

Assistant:

static void
/*ARGSUSED*/
re_insert(EditLine *el __attribute__((__unused__)),
    wchar_t *d, int dat, int dlen, wchar_t *s, int num)
{
	wchar_t *a, *b;

	if (num <= 0)
		return;
	if (num > dlen - dat)
		num = dlen - dat;

	ELRE_DEBUG(1,
	    (__F, "re_insert() starting: %d at %d max %d, d == \"%s\"\n",
	    num, dat, dlen, ct_encode_string(d, &el->el_scratch)));
	ELRE_DEBUG(1, (__F, "s == \"%s\"\n", ct_encode_string(s,
	    &el->el_scratch)));

	/* open up the space for num chars */
	if (num > 0) {
		b = d + dlen - 1;
		a = b - num;
		while (a >= &d[dat])
			*b-- = *a--;
		d[dlen] = '\0';	/* just in case */
	}

	ELRE_DEBUG(1, (__F,
		"re_insert() after insert: %d at %d max %d, d == \"%s\"\n",
		num, dat, dlen, ct_encode_string(d, &el->el_scratch)));
	ELRE_DEBUG(1, (__F, "s == \"%s\"\n", ct_encode_string(s,
		&el->el_scratch)));

	/* copy the characters */
	for (a = d + dat; (a < d + dlen) && (num > 0); num--)
		*a++ = *s++;

#ifdef notyet
        /* ct_encode_string() uses a static buffer, so we can't conveniently
         * encode both d & s here */
	ELRE_DEBUG(1,
	    (__F, "re_insert() after copy: %d at %d max %d, %s == \"%s\"\n",
	    num, dat, dlen, d, s));
	ELRE_DEBUG(1, (__F, "s == \"%s\"\n", s));
#endif
}